

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

int __thiscall
cmGlobalGenerator::TryCompile
          (cmGlobalGenerator *this,string *srcdir,string *bindir,string *projectName,string *target,
          bool fast,string *output,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *this_00;
  int iVar2;
  char *pcVar3;
  float prog;
  float fVar4;
  string newTarget;
  string local_98;
  string *local_78;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string config;
  
  this_00 = this->CMakeInstance->State;
  paVar1 = &newTarget.field_2;
  newTarget._M_dataplus._M_p = (pointer)paVar1;
  local_78 = bindir;
  local_70 = projectName;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&newTarget,"CMAKE_NUMBER_OF_MAKEFILES","");
  pcVar3 = cmState::GetInitializedCacheValue(this_00,&newTarget);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newTarget._M_dataplus._M_p != paVar1) {
    operator_delete(newTarget._M_dataplus._M_p,
                    CONCAT71(newTarget.field_2._M_allocated_capacity._1_7_,
                             newTarget.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 == (char *)0x0) {
    fVar4 = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    prog = 0.95;
    if (fVar4 <= 0.95) {
      prog = fVar4;
    }
    this->FirstTimeProgress = prog;
    cmake::UpdateProgress(this->CMakeInstance,"Configuring",prog);
  }
  newTarget._M_string_length = 0;
  newTarget.field_2._M_local_buf[0] = '\0';
  newTarget._M_dataplus._M_p = (pointer)paVar1;
  if (target->_M_string_length != 0) {
    std::__cxx11::string::_M_append((char *)&newTarget,(ulong)(target->_M_dataplus)._M_p);
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"CMAKE_TRY_COMPILE_CONFIGURATION","");
  pcVar3 = cmMakefile::GetSafeDefinition(mf,&local_98);
  std::__cxx11::string::string((string *)&config,pcVar3,(allocator *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = Build(this,(string *)(ulong)fast,local_78,local_70,&newTarget,output,&local_98,&config,
                false,fast,false,(double)this->TryCompileTimeout,OUTPUT_NONE,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newTarget._M_dataplus._M_p != &newTarget.field_2) {
    operator_delete(newTarget._M_dataplus._M_p,
                    CONCAT71(newTarget.field_2._M_allocated_capacity._1_7_,
                             newTarget.field_2._M_local_buf[0]) + 1);
  }
  return iVar2;
}

Assistant:

int cmGlobalGenerator::TryCompile(const std::string& srcdir,
                                  const std::string& bindir,
                                  const std::string& projectName,
                                  const std::string& target, bool fast,
                                  std::string& output, cmMakefile* mf)
{
  // if this is not set, then this is a first time configure
  // and there is a good chance that the try compile stuff will
  // take the bulk of the time, so try and guess some progress
  // by getting closer and closer to 100 without actually getting there.
  if (!this->CMakeInstance->GetState()->GetInitializedCacheValue(
        "CMAKE_NUMBER_OF_MAKEFILES")) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move 1/10th of the way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
  }

  std::string newTarget;
  if (!target.empty()) {
    newTarget += target;
#if 0
#if defined(_WIN32) || defined(__CYGWIN__)
    std::string tmp = target;
    // if the target does not already end in . something
    // then assume .exe
    if(tmp.size() < 4 || tmp[tmp.size()-4] != '.')
      {
      newTarget += ".exe";
      }
#endif // WIN32
#endif
  }
  std::string config =
    mf->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  return this->Build(srcdir, bindir, projectName, newTarget, output, "",
                     config, false, fast, false, this->TryCompileTimeout);
}